

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

NativePixelAttribs Diligent::GetNativePixelTransferAttribs(TEXTURE_FORMAT TexFormat)

{
  int iVar1;
  reference pvVar2;
  Char *Message;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  NativePixelAttribs NVar4;
  char (*in_stack_fffffffffffffa98) [2];
  char local_538 [4];
  uint local_534;
  undefined1 local_530 [8];
  string msg;
  Bool local_508;
  NativePixelAttribs local_504;
  NativePixelAttribs local_4f8;
  NativePixelAttribs local_4ec;
  NativePixelAttribs local_4e0;
  NativePixelAttribs local_4d4;
  NativePixelAttribs local_4c8;
  NativePixelAttribs local_4bc;
  NativePixelAttribs local_4b0;
  NativePixelAttribs local_4a4;
  NativePixelAttribs local_498;
  NativePixelAttribs local_48c;
  NativePixelAttribs local_480;
  NativePixelAttribs local_474;
  NativePixelAttribs local_468;
  NativePixelAttribs local_45c;
  NativePixelAttribs local_450;
  NativePixelAttribs local_444;
  NativePixelAttribs local_438;
  NativePixelAttribs local_42c;
  NativePixelAttribs local_420;
  NativePixelAttribs local_414;
  NativePixelAttribs local_408;
  NativePixelAttribs local_3fc;
  NativePixelAttribs local_3f0;
  NativePixelAttribs local_3e4;
  NativePixelAttribs local_3d8;
  NativePixelAttribs local_3cc;
  NativePixelAttribs local_3c0;
  NativePixelAttribs local_3b4;
  NativePixelAttribs local_3a8;
  NativePixelAttribs local_39c;
  NativePixelAttribs local_390;
  NativePixelAttribs local_384;
  NativePixelAttribs local_378;
  NativePixelAttribs local_36c;
  NativePixelAttribs local_360;
  NativePixelAttribs local_354;
  NativePixelAttribs local_348;
  NativePixelAttribs local_33c;
  NativePixelAttribs local_330;
  NativePixelAttribs local_324;
  NativePixelAttribs local_318;
  NativePixelAttribs local_30c;
  NativePixelAttribs local_300;
  NativePixelAttribs local_2f4;
  NativePixelAttribs local_2e8;
  NativePixelAttribs local_2dc;
  NativePixelAttribs local_2d0;
  NativePixelAttribs local_2c4;
  NativePixelAttribs local_2b8;
  NativePixelAttribs local_2ac;
  NativePixelAttribs local_2a0;
  NativePixelAttribs local_294;
  NativePixelAttribs local_288;
  NativePixelAttribs local_27c;
  NativePixelAttribs local_270;
  NativePixelAttribs local_264;
  NativePixelAttribs local_258;
  NativePixelAttribs local_24c;
  NativePixelAttribs local_240;
  NativePixelAttribs local_234;
  NativePixelAttribs local_228;
  NativePixelAttribs local_21c;
  NativePixelAttribs local_210;
  NativePixelAttribs local_204;
  NativePixelAttribs local_1f8;
  NativePixelAttribs local_1ec;
  NativePixelAttribs local_1e0;
  NativePixelAttribs local_1d4;
  NativePixelAttribs local_1c8;
  NativePixelAttribs local_1bc;
  NativePixelAttribs local_1b0;
  NativePixelAttribs local_1a4;
  NativePixelAttribs local_198;
  NativePixelAttribs local_18c;
  NativePixelAttribs local_180;
  NativePixelAttribs local_174;
  NativePixelAttribs local_168;
  NativePixelAttribs local_15c;
  NativePixelAttribs local_150;
  NativePixelAttribs local_144;
  NativePixelAttribs local_138;
  NativePixelAttribs local_12c;
  NativePixelAttribs local_120;
  NativePixelAttribs local_114;
  NativePixelAttribs local_108;
  NativePixelAttribs local_fc;
  NativePixelAttribs local_f0;
  NativePixelAttribs local_e4;
  NativePixelAttribs local_d8;
  NativePixelAttribs local_cc;
  NativePixelAttribs local_c0;
  NativePixelAttribs local_b4;
  NativePixelAttribs local_a8;
  NativePixelAttribs local_9c;
  NativePixelAttribs local_90;
  NativePixelAttribs local_84;
  NativePixelAttribs local_78;
  NativePixelAttribs local_6c;
  NativePixelAttribs local_60;
  NativePixelAttribs local_54;
  NativePixelAttribs local_48;
  NativePixelAttribs local_3c;
  NativePixelAttribs local_30;
  NativePixelAttribs local_24;
  TEXTURE_FORMAT local_16;
  undefined4 uStack_14;
  undefined4 uStack_10;
  TEXTURE_FORMAT TexFormat_local;
  undefined1 local_c;
  
  local_16 = TexFormat;
  if (GetNativePixelTransferAttribs(Diligent::TEXTURE_FORMAT)::FmtToGLPixelFmt == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNativePixelTransferAttribs(Diligent::TEXTURE_FORMAT)::
                                 FmtToGLPixelFmt);
    if (iVar1 != 0) {
      std::array<Diligent::NativePixelAttribs,_106UL>::array
                (&GetNativePixelTransferAttribs::FmtToGLPixelFmt);
      __cxa_guard_release(&GetNativePixelTransferAttribs(Diligent::TEXTURE_FORMAT)::FmtToGLPixelFmt)
      ;
    }
  }
  if ((GetNativePixelTransferAttribs::bAttribsMapInitialized & 1U) == 0) {
    NativePixelAttribs::NativePixelAttribs(&local_24);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0);
    pvVar2->PixelFormat = local_24.PixelFormat;
    pvVar2->DataType = local_24.DataType;
    pvVar2->IsCompressed = local_24.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_30,0x1908,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,1);
    pvVar2->PixelFormat = local_30.PixelFormat;
    pvVar2->DataType = local_30.DataType;
    pvVar2->IsCompressed = local_30.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3c,0x1908,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,2);
    pvVar2->PixelFormat = local_3c.PixelFormat;
    pvVar2->DataType = local_3c.DataType;
    pvVar2->IsCompressed = local_3c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_48,0x8d99,0x1405,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,3);
    pvVar2->PixelFormat = local_48.PixelFormat;
    pvVar2->DataType = local_48.DataType;
    pvVar2->IsCompressed = local_48.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_54,0x8d99,0x1404,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,4);
    pvVar2->PixelFormat = local_54.PixelFormat;
    pvVar2->DataType = local_54.DataType;
    pvVar2->IsCompressed = local_54.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_60,0x1907,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,5);
    pvVar2->PixelFormat = local_60.PixelFormat;
    pvVar2->DataType = local_60.DataType;
    pvVar2->IsCompressed = local_60.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_6c,0x1907,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,6);
    pvVar2->PixelFormat = local_6c.PixelFormat;
    pvVar2->DataType = local_6c.DataType;
    pvVar2->IsCompressed = local_6c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_78,0x8d98,0x1405,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,7);
    pvVar2->PixelFormat = local_78.PixelFormat;
    pvVar2->DataType = local_78.DataType;
    pvVar2->IsCompressed = local_78.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_84,0x8d98,0x1404,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,8);
    pvVar2->PixelFormat = local_84.PixelFormat;
    pvVar2->DataType = local_84.DataType;
    pvVar2->IsCompressed = local_84.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_90,0x1908,0x140b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,9);
    pvVar2->PixelFormat = local_90.PixelFormat;
    pvVar2->DataType = local_90.DataType;
    pvVar2->IsCompressed = local_90.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_9c,0x1908,0x140b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,10);
    pvVar2->PixelFormat = local_9c.PixelFormat;
    pvVar2->DataType = local_9c.DataType;
    pvVar2->IsCompressed = local_9c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_a8,0x1908,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0xb);
    pvVar2->PixelFormat = local_a8.PixelFormat;
    pvVar2->DataType = local_a8.DataType;
    pvVar2->IsCompressed = local_a8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_b4,0x8d99,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0xc);
    pvVar2->PixelFormat = local_b4.PixelFormat;
    pvVar2->DataType = local_b4.DataType;
    pvVar2->IsCompressed = local_b4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_c0,0x1908,0x1402,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0xd);
    pvVar2->PixelFormat = local_c0.PixelFormat;
    pvVar2->DataType = local_c0.DataType;
    pvVar2->IsCompressed = local_c0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_cc,0x8d99,0x1402,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0xe);
    pvVar2->PixelFormat = local_cc.PixelFormat;
    pvVar2->DataType = local_cc.DataType;
    pvVar2->IsCompressed = local_cc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_d8,0x8227,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0xf);
    pvVar2->PixelFormat = local_d8.PixelFormat;
    pvVar2->DataType = local_d8.DataType;
    pvVar2->IsCompressed = local_d8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_e4,0x8227,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x10);
    pvVar2->PixelFormat = local_e4.PixelFormat;
    pvVar2->DataType = local_e4.DataType;
    pvVar2->IsCompressed = local_e4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_f0,0x8228,0x1405,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x11);
    pvVar2->PixelFormat = local_f0.PixelFormat;
    pvVar2->DataType = local_f0.DataType;
    pvVar2->IsCompressed = local_f0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_fc,0x8228,0x1404,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x12);
    pvVar2->PixelFormat = local_fc.PixelFormat;
    pvVar2->DataType = local_fc.DataType;
    pvVar2->IsCompressed = local_fc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_108,0x84f9,0x8dad,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x13);
    pvVar2->PixelFormat = local_108.PixelFormat;
    pvVar2->DataType = local_108.DataType;
    pvVar2->IsCompressed = local_108.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_114,0x84f9,0x8dad,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x14);
    pvVar2->PixelFormat = local_114.PixelFormat;
    pvVar2->DataType = local_114.DataType;
    pvVar2->IsCompressed = local_114.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_120,0x84f9,0x8dad,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x15);
    pvVar2->PixelFormat = local_120.PixelFormat;
    pvVar2->DataType = local_120.DataType;
    pvVar2->IsCompressed = local_120.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_12c,0x84f9,0x8dad,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x16);
    pvVar2->PixelFormat = local_12c.PixelFormat;
    pvVar2->DataType = local_12c.DataType;
    pvVar2->IsCompressed = local_12c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_138,0x1908,0x8368,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x17);
    pvVar2->PixelFormat = local_138.PixelFormat;
    pvVar2->DataType = local_138.DataType;
    pvVar2->IsCompressed = local_138.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_144,0x1908,0x8368,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x18);
    pvVar2->PixelFormat = local_144.PixelFormat;
    pvVar2->DataType = local_144.DataType;
    pvVar2->IsCompressed = local_144.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_150,0x8d99,0x8368,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x19);
    pvVar2->PixelFormat = local_150.PixelFormat;
    pvVar2->DataType = local_150.DataType;
    pvVar2->IsCompressed = local_150.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_15c,0x1907,0x8c3b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x1a);
    pvVar2->PixelFormat = local_15c.PixelFormat;
    pvVar2->DataType = local_15c.DataType;
    pvVar2->IsCompressed = local_15c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_168,0x1908,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x1b);
    pvVar2->PixelFormat = local_168.PixelFormat;
    pvVar2->DataType = local_168.DataType;
    pvVar2->IsCompressed = local_168.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_174,0x1908,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x1c);
    pvVar2->PixelFormat = local_174.PixelFormat;
    pvVar2->DataType = local_174.DataType;
    pvVar2->IsCompressed = local_174.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_180,0x1908,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x1d);
    pvVar2->PixelFormat = local_180.PixelFormat;
    pvVar2->DataType = local_180.DataType;
    pvVar2->IsCompressed = local_180.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_18c,0x8d99,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x1e);
    pvVar2->PixelFormat = local_18c.PixelFormat;
    pvVar2->DataType = local_18c.DataType;
    pvVar2->IsCompressed = local_18c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_198,0x1908,0x1400,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x1f);
    pvVar2->PixelFormat = local_198.PixelFormat;
    pvVar2->DataType = local_198.DataType;
    pvVar2->IsCompressed = local_198.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1a4,0x8d99,0x1400,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x20);
    pvVar2->PixelFormat = local_1a4.PixelFormat;
    pvVar2->DataType = local_1a4.DataType;
    pvVar2->IsCompressed = local_1a4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1b0,0x8227,0x140b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x21);
    pvVar2->PixelFormat = local_1b0.PixelFormat;
    pvVar2->DataType = local_1b0.DataType;
    pvVar2->IsCompressed = local_1b0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1bc,0x8227,0x140b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x22);
    pvVar2->PixelFormat = local_1bc.PixelFormat;
    pvVar2->DataType = local_1bc.DataType;
    pvVar2->IsCompressed = local_1bc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1c8,0x8227,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x23);
    pvVar2->PixelFormat = local_1c8.PixelFormat;
    pvVar2->DataType = local_1c8.DataType;
    pvVar2->IsCompressed = local_1c8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1d4,0x8228,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x24);
    pvVar2->PixelFormat = local_1d4.PixelFormat;
    pvVar2->DataType = local_1d4.DataType;
    pvVar2->IsCompressed = local_1d4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1e0,0x8227,0x1402,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x25);
    pvVar2->PixelFormat = local_1e0.PixelFormat;
    pvVar2->DataType = local_1e0.DataType;
    pvVar2->IsCompressed = local_1e0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1ec,0x8228,0x1402,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x26);
    pvVar2->PixelFormat = local_1ec.PixelFormat;
    pvVar2->DataType = local_1ec.DataType;
    pvVar2->IsCompressed = local_1ec.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_1f8,0x1903,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x27);
    pvVar2->PixelFormat = local_1f8.PixelFormat;
    pvVar2->DataType = local_1f8.DataType;
    pvVar2->IsCompressed = local_1f8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_204,0x1902,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x28);
    pvVar2->PixelFormat = local_204.PixelFormat;
    pvVar2->DataType = local_204.DataType;
    pvVar2->IsCompressed = local_204.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_210,0x1903,0x1406,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x29);
    pvVar2->PixelFormat = local_210.PixelFormat;
    pvVar2->DataType = local_210.DataType;
    pvVar2->IsCompressed = local_210.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_21c,0x8d94,0x1405,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x2a);
    pvVar2->PixelFormat = local_21c.PixelFormat;
    pvVar2->DataType = local_21c.DataType;
    pvVar2->IsCompressed = local_21c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_228,0x8d94,0x1404,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x2b);
    pvVar2->PixelFormat = local_228.PixelFormat;
    pvVar2->DataType = local_228.DataType;
    pvVar2->IsCompressed = local_228.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_234,0x84f9,0x84fa,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x2c);
    pvVar2->PixelFormat = local_234.PixelFormat;
    pvVar2->DataType = local_234.DataType;
    pvVar2->IsCompressed = local_234.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_240,0x84f9,0x84fa,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x2d);
    pvVar2->PixelFormat = local_240.PixelFormat;
    pvVar2->DataType = local_240.DataType;
    pvVar2->IsCompressed = local_240.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_24c,0x84f9,0x84fa,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x2e);
    pvVar2->PixelFormat = local_24c.PixelFormat;
    pvVar2->DataType = local_24c.DataType;
    pvVar2->IsCompressed = local_24c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_258,0x84f9,0x84fa,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x2f);
    pvVar2->PixelFormat = local_258.PixelFormat;
    pvVar2->DataType = local_258.DataType;
    pvVar2->IsCompressed = local_258.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_264,0x8227,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x30);
    pvVar2->PixelFormat = local_264.PixelFormat;
    pvVar2->DataType = local_264.DataType;
    pvVar2->IsCompressed = local_264.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_270,0x8227,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x31);
    pvVar2->PixelFormat = local_270.PixelFormat;
    pvVar2->DataType = local_270.DataType;
    pvVar2->IsCompressed = local_270.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_27c,0x8228,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x32);
    pvVar2->PixelFormat = local_27c.PixelFormat;
    pvVar2->DataType = local_27c.DataType;
    pvVar2->IsCompressed = local_27c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_288,0x8227,0x1400,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x33);
    pvVar2->PixelFormat = local_288.PixelFormat;
    pvVar2->DataType = local_288.DataType;
    pvVar2->IsCompressed = local_288.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_294,0x8228,0x1400,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x34);
    pvVar2->PixelFormat = local_294.PixelFormat;
    pvVar2->DataType = local_294.DataType;
    pvVar2->IsCompressed = local_294.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2a0,0x1903,0x140b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x35);
    pvVar2->PixelFormat = local_2a0.PixelFormat;
    pvVar2->DataType = local_2a0.DataType;
    pvVar2->IsCompressed = local_2a0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2ac,0x1903,0x140b,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x36);
    pvVar2->PixelFormat = local_2ac.PixelFormat;
    pvVar2->DataType = local_2ac.DataType;
    pvVar2->IsCompressed = local_2ac.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2b8,0x1902,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x37);
    pvVar2->PixelFormat = local_2b8.PixelFormat;
    pvVar2->DataType = local_2b8.DataType;
    pvVar2->IsCompressed = local_2b8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2c4,0x1903,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x38);
    pvVar2->PixelFormat = local_2c4.PixelFormat;
    pvVar2->DataType = local_2c4.DataType;
    pvVar2->IsCompressed = local_2c4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2d0,0x8d94,0x1403,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x39);
    pvVar2->PixelFormat = local_2d0.PixelFormat;
    pvVar2->DataType = local_2d0.DataType;
    pvVar2->IsCompressed = local_2d0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2dc,0x1903,0x1402,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x3a);
    pvVar2->PixelFormat = local_2dc.PixelFormat;
    pvVar2->DataType = local_2dc.DataType;
    pvVar2->IsCompressed = local_2dc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2e8,0x8d94,0x1402,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x3b);
    pvVar2->PixelFormat = local_2e8.PixelFormat;
    pvVar2->DataType = local_2e8.DataType;
    pvVar2->IsCompressed = local_2e8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_2f4,0x1903,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x3c);
    pvVar2->PixelFormat = local_2f4.PixelFormat;
    pvVar2->DataType = local_2f4.DataType;
    pvVar2->IsCompressed = local_2f4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_300,0x1903,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x3d);
    pvVar2->PixelFormat = local_300.PixelFormat;
    pvVar2->DataType = local_300.DataType;
    pvVar2->IsCompressed = local_300.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_30c,0x8d94,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x3e);
    pvVar2->PixelFormat = local_30c.PixelFormat;
    pvVar2->DataType = local_30c.DataType;
    pvVar2->IsCompressed = local_30c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_318,0x1903,0x1400,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x3f);
    pvVar2->PixelFormat = local_318.PixelFormat;
    pvVar2->DataType = local_318.DataType;
    pvVar2->IsCompressed = local_318.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_324,0x8d94,0x1400,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x40);
    pvVar2->PixelFormat = local_324.PixelFormat;
    pvVar2->DataType = local_324.DataType;
    pvVar2->IsCompressed = local_324.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_330,0x1903,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x41);
    pvVar2->PixelFormat = local_330.PixelFormat;
    pvVar2->DataType = local_330.DataType;
    pvVar2->IsCompressed = local_330.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_33c);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x42);
    pvVar2->PixelFormat = local_33c.PixelFormat;
    pvVar2->DataType = local_33c.DataType;
    pvVar2->IsCompressed = local_33c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_348,0x1907,0x8c3e,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x43);
    pvVar2->PixelFormat = local_348.PixelFormat;
    pvVar2->DataType = local_348.DataType;
    pvVar2->IsCompressed = local_348.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_354);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x44);
    pvVar2->PixelFormat = local_354.PixelFormat;
    pvVar2->DataType = local_354.DataType;
    pvVar2->IsCompressed = local_354.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_360);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x45);
    pvVar2->PixelFormat = local_360.PixelFormat;
    pvVar2->DataType = local_360.DataType;
    pvVar2->IsCompressed = local_360.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_36c,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x46);
    pvVar2->PixelFormat = local_36c.PixelFormat;
    pvVar2->DataType = local_36c.DataType;
    pvVar2->IsCompressed = local_36c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_378,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x47);
    pvVar2->PixelFormat = local_378.PixelFormat;
    pvVar2->DataType = local_378.DataType;
    pvVar2->IsCompressed = local_378.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_384,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x48);
    pvVar2->PixelFormat = local_384.PixelFormat;
    pvVar2->DataType = local_384.DataType;
    pvVar2->IsCompressed = local_384.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_390,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x49);
    pvVar2->PixelFormat = local_390.PixelFormat;
    pvVar2->DataType = local_390.DataType;
    pvVar2->IsCompressed = local_390.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_39c,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x4a);
    pvVar2->PixelFormat = local_39c.PixelFormat;
    pvVar2->DataType = local_39c.DataType;
    pvVar2->IsCompressed = local_39c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3a8,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x4b);
    pvVar2->PixelFormat = local_3a8.PixelFormat;
    pvVar2->DataType = local_3a8.DataType;
    pvVar2->IsCompressed = local_3a8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3b4,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x4c);
    pvVar2->PixelFormat = local_3b4.PixelFormat;
    pvVar2->DataType = local_3b4.DataType;
    pvVar2->IsCompressed = local_3b4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3c0,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x4d);
    pvVar2->PixelFormat = local_3c0.PixelFormat;
    pvVar2->DataType = local_3c0.DataType;
    pvVar2->IsCompressed = local_3c0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3cc,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x4e);
    pvVar2->PixelFormat = local_3cc.PixelFormat;
    pvVar2->DataType = local_3cc.DataType;
    pvVar2->IsCompressed = local_3cc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3d8,0x1903,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x4f);
    pvVar2->PixelFormat = local_3d8.PixelFormat;
    pvVar2->DataType = local_3d8.DataType;
    pvVar2->IsCompressed = local_3d8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3e4,0x1903,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x50);
    pvVar2->PixelFormat = local_3e4.PixelFormat;
    pvVar2->DataType = local_3e4.DataType;
    pvVar2->IsCompressed = local_3e4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3f0,0x1903,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x51);
    pvVar2->PixelFormat = local_3f0.PixelFormat;
    pvVar2->DataType = local_3f0.DataType;
    pvVar2->IsCompressed = local_3f0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_3fc,0x8227,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x52);
    pvVar2->PixelFormat = local_3fc.PixelFormat;
    pvVar2->DataType = local_3fc.DataType;
    pvVar2->IsCompressed = local_3fc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_408,0x8227,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x53);
    pvVar2->PixelFormat = local_408.PixelFormat;
    pvVar2->DataType = local_408.DataType;
    pvVar2->IsCompressed = local_408.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_414,0x8227,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x54);
    pvVar2->PixelFormat = local_414.PixelFormat;
    pvVar2->DataType = local_414.DataType;
    pvVar2->IsCompressed = local_414.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_420,0x1907,0x8364,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x55);
    pvVar2->PixelFormat = local_420.PixelFormat;
    pvVar2->DataType = local_420.DataType;
    pvVar2->IsCompressed = local_420.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_42c,0x1907,0x8366,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x56);
    pvVar2->PixelFormat = local_42c.PixelFormat;
    pvVar2->DataType = local_42c.DataType;
    pvVar2->IsCompressed = local_42c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_438,0x1908,0x1401,false);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x57);
    pvVar2->PixelFormat = local_438.PixelFormat;
    pvVar2->DataType = local_438.DataType;
    pvVar2->IsCompressed = local_438.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_444);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x58);
    pvVar2->PixelFormat = local_444.PixelFormat;
    pvVar2->DataType = local_444.DataType;
    pvVar2->IsCompressed = local_444.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_450);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x59);
    pvVar2->PixelFormat = local_450.PixelFormat;
    pvVar2->DataType = local_450.DataType;
    pvVar2->IsCompressed = local_450.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_45c);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x5a);
    pvVar2->PixelFormat = local_45c.PixelFormat;
    pvVar2->DataType = local_45c.DataType;
    pvVar2->IsCompressed = local_45c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_468);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x5b);
    pvVar2->PixelFormat = local_468.PixelFormat;
    pvVar2->DataType = local_468.DataType;
    pvVar2->IsCompressed = local_468.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_474);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x5c);
    pvVar2->PixelFormat = local_474.PixelFormat;
    pvVar2->DataType = local_474.DataType;
    pvVar2->IsCompressed = local_474.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_480);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x5d);
    pvVar2->PixelFormat = local_480.PixelFormat;
    pvVar2->DataType = local_480.DataType;
    pvVar2->IsCompressed = local_480.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_48c,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x5e);
    pvVar2->PixelFormat = local_48c.PixelFormat;
    pvVar2->DataType = local_48c.DataType;
    pvVar2->IsCompressed = local_48c.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_498,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x5f);
    pvVar2->PixelFormat = local_498.PixelFormat;
    pvVar2->DataType = local_498.DataType;
    pvVar2->IsCompressed = local_498.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4a4,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x60);
    pvVar2->PixelFormat = local_4a4.PixelFormat;
    pvVar2->DataType = local_4a4.DataType;
    pvVar2->IsCompressed = local_4a4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4b0,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x61);
    pvVar2->PixelFormat = local_4b0.PixelFormat;
    pvVar2->DataType = local_4b0.DataType;
    pvVar2->IsCompressed = local_4b0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4bc,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x62);
    pvVar2->PixelFormat = local_4bc.PixelFormat;
    pvVar2->DataType = local_4bc.DataType;
    pvVar2->IsCompressed = local_4bc.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4c8,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,99);
    pvVar2->PixelFormat = local_4c8.PixelFormat;
    pvVar2->DataType = local_4c8.DataType;
    pvVar2->IsCompressed = local_4c8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4d4,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,100);
    pvVar2->PixelFormat = local_4d4.PixelFormat;
    pvVar2->DataType = local_4d4.DataType;
    pvVar2->IsCompressed = local_4d4.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4e0,0x1907,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x65);
    pvVar2->PixelFormat = local_4e0.PixelFormat;
    pvVar2->DataType = local_4e0.DataType;
    pvVar2->IsCompressed = local_4e0.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4ec,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x66);
    pvVar2->PixelFormat = local_4ec.PixelFormat;
    pvVar2->DataType = local_4ec.DataType;
    pvVar2->IsCompressed = local_4ec.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_4f8,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x67);
    pvVar2->PixelFormat = local_4f8.PixelFormat;
    pvVar2->DataType = local_4f8.DataType;
    pvVar2->IsCompressed = local_4f8.IsCompressed;
    NativePixelAttribs::NativePixelAttribs(&local_504,0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x68);
    pvVar2->PixelFormat = local_504.PixelFormat;
    pvVar2->DataType = local_504.DataType;
    pvVar2->IsCompressed = local_504.IsCompressed;
    NativePixelAttribs::NativePixelAttribs
              ((NativePixelAttribs *)((long)&msg.field_2 + 8),0x1908,0,true);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0x69);
    pvVar2->PixelFormat = msg.field_2._8_4_;
    pvVar2->DataType = msg.field_2._12_4_;
    pvVar2->IsCompressed = local_508;
    GetNativePixelTransferAttribs::bAttribsMapInitialized = true;
  }
  if ((local_16 == TEX_FORMAT_UNKNOWN) || (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < local_16)) {
    local_534 = (uint)local_16;
    local_538[0] = 'i';
    local_538[1] = '\0';
    local_538[2] = '\0';
    local_538[3] = '\0';
    FormatString<char[17],int,char[31],int,char[2]>
              ((string *)local_530,(Diligent *)"Texture format (",(char (*) [17])&local_534,
               (int *)") is out of allowed range [1, ",(char (*) [31])local_538,(int *)0x465aaf,
               in_stack_fffffffffffffa98);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetNativePixelTransferAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x1b5);
    std::__cxx11::string::~string((string *)local_530);
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,0);
    uStack_14 = pvVar2->PixelFormat;
    uStack_10 = pvVar2->DataType;
    local_c = (undefined1)*(undefined4 *)&pvVar2->IsCompressed;
    uVar3 = extraout_RDX_00;
  }
  else {
    pvVar2 = std::array<Diligent::NativePixelAttribs,_106UL>::operator[]
                       (&GetNativePixelTransferAttribs::FmtToGLPixelFmt,(ulong)local_16);
    uStack_14 = pvVar2->PixelFormat;
    uStack_10 = pvVar2->DataType;
    local_c = (undefined1)*(undefined4 *)&pvVar2->IsCompressed;
    uVar3 = extraout_RDX;
  }
  NVar4._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),local_c);
  NVar4.PixelFormat = uStack_14;
  NVar4.DataType = uStack_10;
  return NVar4;
}

Assistant:

NativePixelAttribs GetNativePixelTransferAttribs(TEXTURE_FORMAT TexFormat)
{
    // http://www.opengl.org/wiki/Pixel_Transfer

    static std::array<NativePixelAttribs, TEX_FORMAT_NUM_FORMATS> FmtToGLPixelFmt;

    static bool bAttribsMapInitialized = false;
    if (!bAttribsMapInitialized)
    {
        // clang-format off
        // http://www.opengl.org/wiki/Image_Format
        FmtToGLPixelFmt[TEX_FORMAT_UNKNOWN]                = NativePixelAttribs{};

        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_TYPELESS]        = NativePixelAttribs{GL_RGBA,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_FLOAT]           = NativePixelAttribs{GL_RGBA,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_UINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA32_SINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_RGB32_TYPELESS]         = NativePixelAttribs{GL_RGB,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGB32_FLOAT]            = NativePixelAttribs{GL_RGB,         GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGB32_UINT]             = NativePixelAttribs{GL_RGB_INTEGER, GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_RGB32_SINT]             = NativePixelAttribs{GL_RGB_INTEGER, GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_TYPELESS]        = NativePixelAttribs{GL_RGBA,         GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_FLOAT]           = NativePixelAttribs{GL_RGBA,         GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_UNORM]           = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_UINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_SNORM]           = NativePixelAttribs{GL_RGBA,         GL_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA16_SINT]            = NativePixelAttribs{GL_RGBA_INTEGER, GL_SHORT};

        FmtToGLPixelFmt[TEX_FORMAT_RG32_TYPELESS]          = NativePixelAttribs{GL_RG,           GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG32_FLOAT]             = NativePixelAttribs{GL_RG,           GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG32_UINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_RG32_SINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_R32G8X24_TYPELESS]      = NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};
        FmtToGLPixelFmt[TEX_FORMAT_D32_FLOAT_S8X24_UINT]   = NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};
        FmtToGLPixelFmt[TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS]=NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};
        FmtToGLPixelFmt[TEX_FORMAT_X32_TYPELESS_G8X24_UINT]= NativePixelAttribs{GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV};

        // Components are normally packed with the first component in the most significant
        // bits of the bitfield, and successive component occupying progressively less
        // significant locations.Types whose token names end with _REV reverse the component
        // packing order from least to most significant locations.
        FmtToGLPixelFmt[TEX_FORMAT_RGB10A2_TYPELESS]       = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_INT_2_10_10_10_REV};
        FmtToGLPixelFmt[TEX_FORMAT_RGB10A2_UNORM]          = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_INT_2_10_10_10_REV};
        FmtToGLPixelFmt[TEX_FORMAT_RGB10A2_UINT]           = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_INT_2_10_10_10_REV};
        FmtToGLPixelFmt[TEX_FORMAT_R11G11B10_FLOAT]        = NativePixelAttribs{GL_RGB,          GL_UNSIGNED_INT_10F_11F_11F_REV};

        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_TYPELESS]         = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_UNORM]            = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_UNORM_SRGB]       = NativePixelAttribs{GL_RGBA,         GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_UINT]             = NativePixelAttribs{GL_RGBA_INTEGER, GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_SNORM]            = NativePixelAttribs{GL_RGBA,         GL_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RGBA8_SINT]             = NativePixelAttribs{GL_RGBA_INTEGER, GL_BYTE};

        FmtToGLPixelFmt[TEX_FORMAT_RG16_TYPELESS]          = NativePixelAttribs{GL_RG,           GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_FLOAT]             = NativePixelAttribs{GL_RG,           GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_UNORM]             = NativePixelAttribs{GL_RG,           GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_UINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_SNORM]             = NativePixelAttribs{GL_RG,           GL_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_RG16_SINT]              = NativePixelAttribs{GL_RG_INTEGER,   GL_SHORT};

        FmtToGLPixelFmt[TEX_FORMAT_R32_TYPELESS]           = NativePixelAttribs{GL_RED,              GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_D32_FLOAT]              = NativePixelAttribs{GL_DEPTH_COMPONENT,  GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_R32_FLOAT]              = NativePixelAttribs{GL_RED,              GL_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_R32_UINT]               = NativePixelAttribs{GL_RED_INTEGER,      GL_UNSIGNED_INT};
        FmtToGLPixelFmt[TEX_FORMAT_R32_SINT]               = NativePixelAttribs{GL_RED_INTEGER,      GL_INT};

        FmtToGLPixelFmt[TEX_FORMAT_R24G8_TYPELESS]         = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};
        FmtToGLPixelFmt[TEX_FORMAT_D24_UNORM_S8_UINT]      = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};
        FmtToGLPixelFmt[TEX_FORMAT_R24_UNORM_X8_TYPELESS]  = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};
        FmtToGLPixelFmt[TEX_FORMAT_X24_TYPELESS_G8_UINT]   = NativePixelAttribs{GL_DEPTH_STENCIL,    GL_UNSIGNED_INT_24_8};

        FmtToGLPixelFmt[TEX_FORMAT_RG8_TYPELESS]           = NativePixelAttribs{GL_RG,           GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_UNORM]              = NativePixelAttribs{GL_RG,           GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_UINT]               = NativePixelAttribs{GL_RG_INTEGER,   GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_SNORM]              = NativePixelAttribs{GL_RG,           GL_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_SINT]               = NativePixelAttribs{GL_RG_INTEGER,   GL_BYTE};

        FmtToGLPixelFmt[TEX_FORMAT_R16_TYPELESS]           = NativePixelAttribs{GL_RED,          GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_FLOAT]              = NativePixelAttribs{GL_RED,          GL_HALF_FLOAT};
        FmtToGLPixelFmt[TEX_FORMAT_D16_UNORM]              = NativePixelAttribs{GL_DEPTH_COMPONENT, GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_UNORM]              = NativePixelAttribs{GL_RED,          GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_UINT]               = NativePixelAttribs{GL_RED_INTEGER,  GL_UNSIGNED_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_SNORM]              = NativePixelAttribs{GL_RED,          GL_SHORT};
        FmtToGLPixelFmt[TEX_FORMAT_R16_SINT]               = NativePixelAttribs{GL_RED_INTEGER,  GL_SHORT};

        FmtToGLPixelFmt[TEX_FORMAT_R8_TYPELESS]            = NativePixelAttribs{GL_RED,          GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_UNORM]               = NativePixelAttribs{GL_RED,          GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_UINT]                = NativePixelAttribs{GL_RED_INTEGER,  GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_SNORM]               = NativePixelAttribs{GL_RED,          GL_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_R8_SINT]                = NativePixelAttribs{GL_RED_INTEGER,  GL_BYTE};
        // To get the same behaviour as expected for TEX_FORMAT_A8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        FmtToGLPixelFmt[TEX_FORMAT_A8_UNORM]               = NativePixelAttribs{GL_RED,          GL_UNSIGNED_BYTE};

        FmtToGLPixelFmt[TEX_FORMAT_R1_UNORM]               = NativePixelAttribs{};

        FmtToGLPixelFmt[TEX_FORMAT_RGB9E5_SHAREDEXP]       = NativePixelAttribs{GL_RGB, GL_UNSIGNED_INT_5_9_9_9_REV};
        FmtToGLPixelFmt[TEX_FORMAT_RG8_B8G8_UNORM]         = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_G8R8_G8B8_UNORM]        = NativePixelAttribs{};

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        FmtToGLPixelFmt[TEX_FORMAT_BC1_TYPELESS]           = NativePixelAttribs{GL_RGB,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC1_UNORM]              = NativePixelAttribs{GL_RGB,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC1_UNORM_SRGB]         = NativePixelAttribs{GL_RGB,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC2_TYPELESS]           = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC2_UNORM]              = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC2_UNORM_SRGB]         = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC3_TYPELESS]           = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC3_UNORM]              = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC3_UNORM_SRGB]         = NativePixelAttribs{GL_RGBA, 0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC4_TYPELESS]           = NativePixelAttribs{GL_RED,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC4_UNORM]              = NativePixelAttribs{GL_RED,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC4_SNORM]              = NativePixelAttribs{GL_RED,  0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC5_TYPELESS]           = NativePixelAttribs{GL_RG,   0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC5_UNORM]              = NativePixelAttribs{GL_RG,   0, True};
        FmtToGLPixelFmt[TEX_FORMAT_BC5_SNORM]              = NativePixelAttribs{GL_RG,   0, True};
        FmtToGLPixelFmt[TEX_FORMAT_B5G6R5_UNORM]           = NativePixelAttribs{GL_RGB,  GL_UNSIGNED_SHORT_5_6_5_REV};
        FmtToGLPixelFmt[TEX_FORMAT_B5G5R5A1_UNORM]         = NativePixelAttribs{GL_RGB,  GL_UNSIGNED_SHORT_1_5_5_5_REV};
        // To get the same behaviour as expected for TEX_FORMAT_BGRA8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        FmtToGLPixelFmt[TEX_FORMAT_BGRA8_UNORM]            = NativePixelAttribs{GL_RGBA, GL_UNSIGNED_BYTE};
        FmtToGLPixelFmt[TEX_FORMAT_BGRX8_UNORM]            = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM] = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRA8_TYPELESS]         = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRA8_UNORM_SRGB]       = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRX8_TYPELESS]         = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BGRX8_UNORM_SRGB]       = NativePixelAttribs{};
        FmtToGLPixelFmt[TEX_FORMAT_BC6H_TYPELESS]          = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC6H_UF16]              = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC6H_SF16]              = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC7_TYPELESS]           = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC7_UNORM]              = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_BC7_UNORM_SRGB]         = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8_UNORM]        = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8_UNORM_SRGB]   = NativePixelAttribs{GL_RGB,  0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8A1_UNORM]      = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB] = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGBA8_UNORM]       = NativePixelAttribs{GL_RGBA, 0,  True};
        FmtToGLPixelFmt[TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB]  = NativePixelAttribs{GL_RGBA, 0,  True};
        // clang-format on
        bAttribsMapInitialized = true;
    }

    if (TexFormat > TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS)
    {
        return FmtToGLPixelFmt[TexFormat];
    }
    else
    {
        UNEXPECTED("Texture format (", int{TexFormat}, ") is out of allowed range [1, ", int{TEX_FORMAT_NUM_FORMATS} - 1, "]");
        return FmtToGLPixelFmt[0];
    }
}